

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest_main.h
# Opt level: O0

void __thiscall bssl::TestEventListener::OnTestEnd(TestEventListener *this,TestInfo *test_info)

{
  bool bVar1;
  TestResult *this_00;
  TestInfo *test_info_local;
  TestEventListener *this_local;
  
  this_00 = testing::TestInfo::result(test_info);
  bVar1 = testing::TestResult::Failed(this_00);
  if (bVar1) {
    ERR_print_errors_fp(_stdout);
  }
  else {
    ERR_clear_error();
  }
  OPENSSL_reset_malloc_counter_for_testing();
  return;
}

Assistant:

void OnTestEnd(const testing::TestInfo &test_info) override {
    if (test_info.result()->Failed()) {
      // The test failed. Print any errors left in the error queue.
      ERR_print_errors_fp(stdout);
    } else {
      // The test succeeded, so any failed operations are expected. Clear the
      // error queue without printing.
      ERR_clear_error();
    }

    // Malloc failure testing is quadratic in the number of mallocs. Running
    // multiple tests sequentially thus scales badly. Reset the malloc counter
    // between tests. This way we will test, each test with the first allocation
    // failing, then the second, and so on, until the test with the most
    // allocations runs out.
    OPENSSL_reset_malloc_counter_for_testing();
  }